

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_poc_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_bool oVar2;
  uint uVar3;
  uint uVar4;
  uint p_nb_bytes;
  opj_poc_t *p_value;
  ulong uVar6;
  OPJ_UINT32 l_tmp;
  OPJ_PROG_ORDER local_44;
  opj_tcp_v2_t *local_40;
  ulong local_38;
  ulong uVar5;
  
  uVar1 = p_j2k->m_private_image->numcomps;
  p_nb_bytes = 2 - (uVar1 < 0x101);
  uVar5 = (ulong)p_nb_bytes;
  uVar3 = p_nb_bytes * 2 + 5;
  oVar2 = 0;
  uVar6 = (ulong)p_header_size / (ulong)uVar3;
  if (p_header_size % uVar3 == 0 && uVar3 <= p_header_size) {
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      local_40 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      local_40 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    uVar3 = 0;
    if ((local_40->field_0x1628 & 2) != 0) {
      uVar3 = local_40->numpocs + 1;
    }
    uVar4 = uVar3 + (int)uVar6;
    local_40->field_0x1628 = local_40->field_0x1628 | 2;
    if (uVar3 < uVar4) {
      p_value = local_40->pocs + uVar3;
      local_38 = uVar5;
      do {
        opj_read_bytes_LE(p_header_data,&p_value->resno0,1);
        opj_read_bytes_LE(p_header_data + 1,&p_value->compno0,p_nb_bytes);
        opj_read_bytes_LE(p_header_data + uVar5 + 1,&p_value->layno1,2);
        opj_read_bytes_LE(p_header_data + uVar5 + 3,&p_value->resno1,1);
        opj_read_bytes_LE(p_header_data + uVar5 + 4,&p_value->compno1,p_nb_bytes);
        opj_read_bytes_LE(p_header_data + uVar5 * 2 + 4,(OPJ_UINT32 *)&local_44,1);
        p_value->prg = local_44;
        uVar3 = p_value->compno1;
        if (uVar1 <= p_value->compno1) {
          uVar3 = uVar1;
        }
        p_value->compno1 = uVar3;
        p_value = p_value + 1;
        p_header_data = p_header_data + uVar5 * 2 + 5;
        uVar3 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar3;
      } while (uVar3 != 0);
    }
    local_40->numpocs = uVar4 - 1;
    oVar2 = 1;
  }
  else {
    opj_event_msg_v2(p_manager,1,"Error reading POC marker\n");
  }
  return oVar2;
}

Assistant:

opj_bool j2k_read_poc_v2 (
						opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 i, l_nb_comp, l_tmp;
	opj_image_t * l_image = 00;
	OPJ_UINT32 l_old_poc_nb, l_current_poc_nb, l_current_poc_remaining;
	OPJ_UINT32 l_chunk_size, l_comp_room;

	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_poc_t *l_current_poc = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_nb_comp = l_image->numcomps;
	if (l_nb_comp <= 256) {
		l_comp_room = 1;
	}
	else {
		l_comp_room = 2;
	}
	l_chunk_size = 5 + 2 * l_comp_room;
	l_current_poc_nb = p_header_size / l_chunk_size;
	l_current_poc_remaining = p_header_size % l_chunk_size;

	if ((l_current_poc_nb <= 0) || (l_current_poc_remaining != 0)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading POC marker\n");
		return OPJ_FALSE;
	}

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;
	l_old_poc_nb = l_tcp->POC ? l_tcp->numpocs + 1 : 0;
	l_current_poc_nb += l_old_poc_nb;

	assert(l_current_poc_nb < 32);

	/* now poc is in use.*/
	l_tcp->POC = 1;

	l_current_poc = &l_tcp->pocs[l_old_poc_nb];
	for	(i = l_old_poc_nb; i < l_current_poc_nb; ++i) {
		opj_read_bytes(p_header_data,&(l_current_poc->resno0),1);				/* RSpoc_i */
		++p_header_data;
		opj_read_bytes(p_header_data,&(l_current_poc->compno0),l_comp_room);	/* CSpoc_i */
		p_header_data+=l_comp_room;
		opj_read_bytes(p_header_data,&(l_current_poc->layno1),2);				/* LYEpoc_i */
		p_header_data+=2;
		opj_read_bytes(p_header_data,&(l_current_poc->resno1),1);				/* REpoc_i */
		++p_header_data;
		opj_read_bytes(p_header_data,&(l_current_poc->compno1),l_comp_room);	/* CEpoc_i */
		p_header_data+=l_comp_room;
		opj_read_bytes(p_header_data,&l_tmp,1);									/* Ppoc_i */
		++p_header_data;
		l_current_poc->prg = (OPJ_PROG_ORDER) l_tmp;
		/* make sure comp is in acceptable bounds */
		l_current_poc->compno1 = uint_min(l_current_poc->compno1, l_nb_comp);
		++l_current_poc;
	}

	l_tcp->numpocs = l_current_poc_nb - 1;
	return OPJ_TRUE;
}